

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O2

void __thiscall unit_test::handle3(unit_test *this)

{
  callback *pcVar1;
  ostream *poVar2;
  callback<void_(cppcms::http::context::completion_type)> local_40;
  intrusive_ptr<unit_test> local_38;
  binder local_30;
  
  cppcms::http::context::response();
  poVar2 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar2,"message1");
  pcVar1 = (callback *)
           (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38.p_ = this;
  booster::intrusive_ptr_add_ref(&this->super_application);
  booster::intrusive_ptr<unit_test>::intrusive_ptr(&local_30.self,&local_38);
  local_30.m = (member_type)handle35;
  local_30._16_8_ = 0;
  booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
            (&local_40,&local_30);
  cppcms::http::context::async_flush_output(pcVar1);
  booster::intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::
  ~intrusive_ptr(&local_40.call_ptr);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_30.self);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_38);
  return;
}

Assistant:

void handle3()
	{
		context_->response().out()<<"message1";
		context_->async_flush_output(binder(this,&unit_test::handle35));
	}